

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_thread_create(ma_context *pContext,ma_thread *pThread,ma_thread_entry_proc entryProc,
                          void *pData)

{
  ma_thread_priority mVar1;
  int iVar2;
  int iVar3;
  ma_result mVar4;
  uint __algorithm;
  undefined1 *puVar5;
  pthread_attr_t attr;
  int local_70;
  int local_6c;
  undefined1 local_68 [56];
  
  if (entryProc == (ma_thread_entry_proc)0x0 ||
      (pThread == (ma_thread *)0x0 || pContext == (ma_context *)0x0)) {
    return 0;
  }
  pThread->pContext = pContext;
  iVar2 = (*(pContext->field_22).posix.pthread_attr_init)();
  mVar4 = 0;
  if (iVar2 != 0) {
    puVar5 = (undefined1 *)0x0;
    goto LAB_00105761;
  }
  if (pContext->threadPriority == ma_thread_priority_realtime) {
    iVar2 = (*(pContext->field_22).posix.pthread_attr_setschedpolicy)(local_68,1);
    __algorithm = -(uint)(iVar2 != 0) | 1;
  }
  else if (pContext->threadPriority == ma_thread_priority_idle) {
    iVar2 = (*(pContext->field_22).posix.pthread_attr_setschedpolicy)(local_68,5);
    __algorithm = -(uint)(iVar2 != 0) | 5;
  }
  else {
    __algorithm = sched_getscheduler(0);
  }
  if (__algorithm == 0xffffffff) {
LAB_001056dd:
    puVar5 = (undefined1 *)0x0;
  }
  else {
    local_6c = sched_get_priority_min(__algorithm);
    iVar2 = sched_get_priority_max(__algorithm);
    iVar3 = (*(pContext->field_22).posix.pthread_attr_getschedparam)(local_68,&local_70);
    if (iVar3 != 0) goto LAB_001056dd;
    mVar1 = pContext->threadPriority;
    iVar3 = iVar2;
    if (mVar1 != ma_thread_priority_realtime) {
      if (mVar1 == ma_thread_priority_idle) {
        local_70 = local_6c;
        iVar3 = local_70;
      }
      else {
        iVar3 = (mVar1 + 5) * ((iVar2 - local_6c) / 7) + local_70;
        if (iVar3 <= local_6c) {
          iVar3 = local_6c;
        }
        if (iVar2 <= iVar3) {
          iVar3 = iVar2;
        }
      }
    }
    local_70 = iVar3;
    iVar2 = (*(pContext->field_22).posix.pthread_attr_setschedparam)(local_68,&local_70);
    puVar5 = (undefined1 *)0x0;
    if (iVar2 == 0) {
      puVar5 = local_68;
    }
  }
  (*(pContext->field_22).posix.pthread_attr_destroy)(local_68);
LAB_00105761:
  iVar2 = (*(pContext->field_22).posix.pthread_create)(&pThread->field_1,puVar5,entryProc,pData);
  if (iVar2 != 0) {
    mVar4 = ma_result_from_errno(iVar2);
  }
  return mVar4;
}

Assistant:

static ma_result ma_thread_create(ma_context* pContext, ma_thread* pThread, ma_thread_entry_proc entryProc, void* pData)
{
    if (pContext == NULL || pThread == NULL || entryProc == NULL) {
        return MA_FALSE;
    }

    pThread->pContext = pContext;

#ifdef MA_WIN32
    return ma_thread_create__win32(pContext, pThread, entryProc, pData);
#endif
#ifdef MA_POSIX
    return ma_thread_create__posix(pContext, pThread, entryProc, pData);
#endif
}